

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O3

void __thiscall
__gnu_cxx::new_allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>>::
construct<asio::ip::basic_resolver_entry<asio::ip::tcp>,asio::ip::basic_resolver_entry<asio::ip::tcp>>
          (new_allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>> *this,
          basic_resolver_entry<asio::ip::tcp> *__p,basic_resolver_entry<asio::ip::tcp> *__args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  
  uVar4 = *(undefined8 *)&(__args->endpoint_).impl_.data_;
  uVar5 = *(undefined8 *)((long)&(__args->endpoint_).impl_.data_ + 8);
  uVar6 = *(undefined8 *)((long)&(__args->endpoint_).impl_.data_ + 0x14);
  *(undefined8 *)((long)&(__p->endpoint_).impl_.data_ + 0xc) =
       *(undefined8 *)((long)&(__args->endpoint_).impl_.data_ + 0xc);
  *(undefined8 *)((long)&(__p->endpoint_).impl_.data_ + 0x14) = uVar6;
  *(undefined8 *)&(__p->endpoint_).impl_.data_ = uVar4;
  *(undefined8 *)((long)&(__p->endpoint_).impl_.data_ + 8) = uVar5;
  paVar1 = &(__p->host_name_).field_2;
  (__p->host_name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (__args->host_name_)._M_dataplus._M_p;
  paVar2 = &(__args->host_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(__args->host_name_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__p->host_name_).field_2 + 8) = uVar4;
  }
  else {
    (__p->host_name_)._M_dataplus._M_p = pcVar3;
    (__p->host_name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__p->host_name_)._M_string_length = (__args->host_name_)._M_string_length;
  (__args->host_name_)._M_dataplus._M_p = (pointer)paVar2;
  (__args->host_name_)._M_string_length = 0;
  (__args->host_name_).field_2._M_local_buf[0] = '\0';
  paVar1 = &(__p->service_name_).field_2;
  (__p->service_name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (__args->service_name_)._M_dataplus._M_p;
  paVar2 = &(__args->service_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(__args->service_name_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__p->service_name_).field_2 + 8) = uVar4;
  }
  else {
    (__p->service_name_)._M_dataplus._M_p = pcVar3;
    (__p->service_name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__p->service_name_)._M_string_length = (__args->service_name_)._M_string_length;
  (__args->service_name_)._M_dataplus._M_p = (pointer)paVar2;
  (__args->service_name_)._M_string_length = 0;
  (__args->service_name_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

endpoint(const endpoint& other) ASIO_NOEXCEPT
    : data_(other.data_)
  {
  }